

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O1

int ord2utf8(uint32_t cvalue,uint8_t *utf8bytes)

{
  int *piVar1;
  int i;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  
  piVar1 = utf8_table1;
  uVar4 = 0;
  do {
    if (cvalue <= (uint)*piVar1) goto LAB_0010aede;
    uVar4 = uVar4 + 1;
    piVar1 = (int *)((uint *)piVar1 + 1);
  } while (uVar4 != 6);
  uVar4 = 6;
LAB_0010aede:
  iVar2 = (int)uVar4;
  pbVar5 = utf8bytes + (uVar4 & 0xffffffff);
  if (0 < iVar2) {
    iVar3 = iVar2 + 1;
    do {
      *pbVar5 = (byte)cvalue & 0x3f | 0x80;
      pbVar5 = pbVar5 + -1;
      cvalue = cvalue >> 6;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  *pbVar5 = (byte)cvalue | (byte)utf8_table2[uVar4 & 0xffffffff];
  return iVar2 + 1;
}

Assistant:

static int
ord2utf8(uint32_t cvalue, uint8_t *utf8bytes)
{
register int i, j;
if (cvalue > 0x7fffffffu)
  return -1;
for (i = 0; i < utf8_table1_size; i++)
  if (cvalue <= (uint32_t)utf8_table1[i]) break;
utf8bytes += i;
for (j = i; j > 0; j--)
 {
 *utf8bytes-- = 0x80 | (cvalue & 0x3f);
 cvalue >>= 6;
 }
*utf8bytes = utf8_table2[i] | cvalue;
return i + 1;
}